

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

FT_UInt tt_cmap14_def_char_count(FT_Byte *p)

{
  FT_UInt FVar1;
  long lVar2;
  
  if (((uint)p[1] * 0x10000 + (uint)*p * 0x1000000 != 0 || p[2] != '\0') || p[3] != '\0') {
    lVar2 = 0;
    FVar1 = 0;
    do {
      FVar1 = FVar1 + p[lVar2 * 4 + 7] + 1;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != (uint)p[1] * 0x10000 + (uint)*p * 0x1000000 + (uint)CONCAT11(p[2],p[3]));
    return FVar1;
  }
  return 0;
}

Assistant:

static FT_UInt
  tt_cmap14_def_char_count( FT_Byte  *p )
  {
    FT_UInt32  numRanges = (FT_UInt32)TT_NEXT_ULONG( p );
    FT_UInt    tot       = 0;


    p += 3;  /* point to the first `cnt' field */
    for ( ; numRanges > 0; numRanges-- )
    {
      tot += 1 + p[0];
      p   += 4;
    }

    return tot;
  }